

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

bool __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::
try_dequeue<loop::MessageLoop::TaskInfo*>
          (ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>
           *this,TaskInfo **item)

{
  long lVar1;
  ExplicitProducer *pEVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ExplicitProducer *this_00;
  ExplicitProducer *pEVar7;
  bool bVar8;
  
  pEVar2 = *(ExplicitProducer **)this;
  if (pEVar2 == (ExplicitProducer *)0x0) {
    bVar8 = true;
    this_00 = (ExplicitProducer *)0x0;
  }
  else {
    this_00 = (ExplicitProducer *)0x0;
    uVar5 = 0;
    uVar3 = 0;
    do {
      uVar6 = *(long *)(pEVar2 + 0x20) - *(long *)(pEVar2 + 0x28);
      if ((ulong)(*(long *)(pEVar2 + 0x28) - *(long *)(pEVar2 + 0x20)) < 0x8000000000000001) {
        uVar6 = 0;
      }
      pEVar7 = this_00;
      uVar4 = uVar3;
      if (uVar3 < uVar6) {
        pEVar7 = pEVar2;
        uVar4 = uVar6;
      }
      if (uVar6 == 0) {
        uVar4 = uVar3;
        pEVar7 = this_00;
      }
      this_00 = pEVar7;
      uVar5 = (uVar6 != 0) + uVar5;
      lVar1 = *(long *)(pEVar2 + 8);
      pEVar2 = (ExplicitProducer *)(lVar1 + -8);
      if (lVar1 == 0) {
        pEVar2 = (ExplicitProducer *)0x0;
      }
    } while ((uVar5 < 3) && (uVar3 = uVar4, lVar1 != 0));
    bVar8 = uVar5 == 0;
  }
  if (!bVar8) {
    if (this_00[0x48] == (ExplicitProducer)0x1) {
      bVar8 = ExplicitProducer::dequeue<loop::MessageLoop::TaskInfo*>(this_00,item);
    }
    else {
      bVar8 = ImplicitProducer::dequeue<loop::MessageLoop::TaskInfo*>
                        ((ImplicitProducer *)this_00,item);
    }
    if (bVar8 != false) {
      return true;
    }
    pEVar2 = *(ExplicitProducer **)this;
    pEVar7 = pEVar2;
    while (pEVar7 != (ExplicitProducer *)0x0) {
      if (pEVar2 != this_00) {
        if (pEVar2[0x48] == (ExplicitProducer)0x1) {
          bVar8 = ExplicitProducer::dequeue<loop::MessageLoop::TaskInfo*>(pEVar2,item);
        }
        else {
          bVar8 = ImplicitProducer::dequeue<loop::MessageLoop::TaskInfo*>
                            ((ImplicitProducer *)pEVar2,item);
        }
        if (bVar8 != false) {
          return true;
        }
      }
      pEVar7 = *(ExplicitProducer **)(pEVar2 + 8);
      pEVar2 = pEVar7 + -8;
    }
  }
  return false;
}

Assistant:

bool try_dequeue(U& item)
	{
		// Instead of simply trying each producer in turn (which could cause needless contention on the first
		// producer), we score them heuristically.
		size_t nonEmptyCount = 0;
		ProducerBase* best = nullptr;
		size_t bestSize = 0;
		for (auto ptr = producerListTail.load(std::memory_order_acquire); nonEmptyCount < 3 && ptr != nullptr; ptr = ptr->next_prod()) {
			auto size = ptr->size_approx();
			if (size > 0) {
				if (size > bestSize) {
					bestSize = size;
					best = ptr;
				}
				++nonEmptyCount;
			}
		}
		
		// If there was at least one non-empty queue but it appears empty at the time
		// we try to dequeue from it, we need to make sure every queue's been tried
		if (nonEmptyCount > 0) {
			if (details::likely(best->dequeue(item))) {
				return true;
			}
			for (auto ptr = producerListTail.load(std::memory_order_acquire); ptr != nullptr; ptr = ptr->next_prod()) {
				if (ptr != best && ptr->dequeue(item)) {
					return true;
				}
			}
		}
		return false;
	}